

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O2

wchar_t ui_entry_renderer_lookup(char *name)

{
  renderer_info *prVar1;
  int iVar2;
  ulong uVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  long lVar6;
  
  prVar1 = renderers;
  uVar3 = (ulong)(uint)renderer_count;
  if (renderer_count < L'\x01') {
    uVar3 = 0;
  }
  wVar5 = L'\x01';
  lVar6 = 0;
  while ((wVar4 = L'\0', uVar3 * 0x58 - lVar6 != 0 &&
         (iVar2 = strcmp(name,*(char **)((long)&prVar1->name + lVar6)), wVar4 = wVar5, iVar2 != 0)))
  {
    wVar5 = wVar5 + L'\x01';
    lVar6 = lVar6 + 0x58;
  }
  return wVar4;
}

Assistant:

int ui_entry_renderer_lookup(const char *name)
{
	int i = 0;

	while (i < renderer_count) {
		if (streq(name, renderers[i].name)) {
			return i + 1;
		}
		++i;
	}
	return 0;
}